

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O1

void Ivy_ObjPatchFanout(Ivy_Man_t *p,Ivy_Obj_t *pFanin,Ivy_Obj_t *pFanoutOld,Ivy_Obj_t *pFanoutNew)

{
  long lVar1;
  Ivy_Obj_t **ppIVar2;
  long *plVar3;
  
  if (((ulong)pFanin & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                  ,0x52,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pFanoutOld & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                  ,0x53,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (pFanoutOld == (Ivy_Obj_t *)0x0) {
    lVar1 = 0;
  }
  else {
    if ((Ivy_Obj_t *)((ulong)pFanoutOld->pFanin0 & 0xfffffffffffffffe) == pFanin) {
      lVar1 = 0x38;
    }
    else {
      lVar1 = 0x40;
      if ((Ivy_Obj_t *)((ulong)pFanoutOld->pFanin1 & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                      ,0x34,"Ivy_Obj_t *Ivy_ObjPrevFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
    }
    lVar1 = *(long *)((long)&pFanoutOld->Id + lVar1);
  }
  if (lVar1 == 0) {
    ppIVar2 = &pFanin->pFanout;
  }
  else if ((Ivy_Obj_t *)(*(ulong *)(lVar1 + 0x10) & 0xfffffffffffffffe) == pFanin) {
    ppIVar2 = (Ivy_Obj_t **)(lVar1 + 0x28);
  }
  else {
    if ((Ivy_Obj_t *)(*(ulong *)(lVar1 + 0x18) & 0xfffffffffffffffe) != pFanin) {
      __assert_fail("Ivy_ObjFanin1(pTemp) == pObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                    ,0x59,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    ppIVar2 = (Ivy_Obj_t **)(lVar1 + 0x30);
  }
  if (*ppIVar2 == pFanoutOld) {
    *ppIVar2 = pFanoutNew;
    if (pFanoutOld == (Ivy_Obj_t *)0x0) {
      lVar1 = 0;
    }
    else {
      if ((Ivy_Obj_t *)((ulong)pFanoutOld->pFanin0 & 0xfffffffffffffffe) == pFanin) {
        lVar1 = 0x28;
      }
      else {
        lVar1 = 0x30;
        if ((Ivy_Obj_t *)((ulong)pFanoutOld->pFanin1 & 0xfffffffffffffffe) != pFanin) {
          __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                        ,0x27,"Ivy_Obj_t *Ivy_ObjNextFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
        }
      }
      lVar1 = *(long *)((long)&pFanoutOld->Id + lVar1);
    }
    if (lVar1 == 0) {
      plVar3 = (long *)0x0;
    }
    else if ((Ivy_Obj_t *)(*(ulong *)(lVar1 + 0x10) & 0xfffffffffffffffe) == pFanin) {
      plVar3 = (long *)(lVar1 + 0x38);
    }
    else {
      if ((Ivy_Obj_t *)(*(ulong *)(lVar1 + 0x18) & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pTemp) == pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                      ,0x68,"Ivy_Obj_t **Ivy_ObjNextPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      plVar3 = (long *)(lVar1 + 0x40);
    }
    if (plVar3 != (long *)0x0) {
      if ((Ivy_Obj_t *)*plVar3 != pFanoutOld) {
        __assert_fail("ppPlace == NULL || *ppPlace == pFanoutOld",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                      ,0xf5,
                      "void Ivy_ObjPatchFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)")
        ;
      }
      *plVar3 = (long)pFanoutNew;
    }
    return;
  }
  __assert_fail("*ppPlace == pFanoutOld",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFanout.c"
                ,0xf1,"void Ivy_ObjPatchFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Obj_t *)")
  ;
}

Assistant:

void Ivy_ObjPatchFanout( Ivy_Man_t * p, Ivy_Obj_t * pFanin, Ivy_Obj_t * pFanoutOld, Ivy_Obj_t * pFanoutNew )
{
    Ivy_Obj_t ** ppPlace;
    ppPlace = Ivy_ObjPrevNextFanoutPlace(pFanin, pFanoutOld);
    assert( *ppPlace == pFanoutOld );
    if ( ppPlace )
        *ppPlace = pFanoutNew;
    ppPlace = Ivy_ObjNextPrevFanoutPlace(pFanin, pFanoutOld);
    assert( ppPlace == NULL || *ppPlace == pFanoutOld );
    if ( ppPlace )
        *ppPlace = pFanoutNew;
    // assuming that pFanoutNew already points to the next fanout
}